

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void leveldb::AddBoundaryInputs
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *level_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *compaction_files)

{
  bool bVar1;
  FileMetaData *local_50;
  FileMetaData *smallest_boundary_file;
  undefined1 local_40 [3];
  bool continue_searching;
  InternalKey largest_key;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *compaction_files_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *level_files_local;
  InternalKeyComparator *icmp_local;
  
  largest_key.rep_.field_2._8_8_ = compaction_files;
  InternalKey::InternalKey((InternalKey *)local_40);
  bVar1 = FindLargestKey(icmp,(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               *)largest_key.rep_.field_2._8_8_,(InternalKey *)local_40);
  if (bVar1) {
    smallest_boundary_file._3_1_ = 1;
    while ((smallest_boundary_file._3_1_ & 1) != 0) {
      local_50 = FindSmallestBoundaryFile(icmp,level_files,(InternalKey *)local_40);
      if (local_50 == (FileMetaData *)0x0) {
        smallest_boundary_file._3_1_ = 0;
      }
      else {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   largest_key.rep_.field_2._8_8_,&local_50);
        InternalKey::operator=((InternalKey *)local_40,&local_50->largest);
      }
    }
    smallest_boundary_file._4_4_ = 0;
  }
  else {
    smallest_boundary_file._4_4_ = 1;
  }
  InternalKey::~InternalKey((InternalKey *)local_40);
  return;
}

Assistant:

void AddBoundaryInputs(const InternalKeyComparator& icmp,
                       const std::vector<FileMetaData*>& level_files,
                       std::vector<FileMetaData*>* compaction_files) {
  InternalKey largest_key;

  // Quick return if compaction_files is empty.
  if (!FindLargestKey(icmp, *compaction_files, &largest_key)) {
    return;
  }

  bool continue_searching = true;
  while (continue_searching) {
    FileMetaData* smallest_boundary_file =
        FindSmallestBoundaryFile(icmp, level_files, largest_key);

    // If a boundary file was found advance largest_key, otherwise we're done.
    if (smallest_boundary_file != NULL) {
      compaction_files->push_back(smallest_boundary_file);
      largest_key = smallest_boundary_file->largest;
    } else {
      continue_searching = false;
    }
  }
}